

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::ReleaseDebugManager(ThreadContext *this)

{
  LONG *pLVar1;
  DebugManager *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableData *pRVar5;
  
  if (this->crefSContextForDiag < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8e9,"(crefSContextForDiag > 0)","crefSContextForDiag > 0");
    if (!bVar3) goto LAB_007b0ee0;
    *puVar4 = 0;
  }
  if (this->debugManager == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8ea,"(this->debugManager != nullptr)","this->debugManager != nullptr");
    if (!bVar3) {
LAB_007b0ee0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pLVar1 = &this->crefSContextForDiag;
  LOCK();
  *pLVar1 = *pLVar1 + -1;
  UNLOCK();
  if (*pLVar1 == 0) {
    if ((this->recyclableData).ptr != (RecyclableData *)0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      (pRVar5->returnedValueList).ptr =
           (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    }
    if (this->debugManager != (DebugManager *)0x0) {
      Js::DebugManager::Close(this->debugManager);
      this_00 = this->debugManager;
      Js::DebugManager::~DebugManager(this_00);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x218);
      this->debugManager = (DebugManager *)0x0;
    }
  }
  return;
}

Assistant:

void ThreadContext::ReleaseDebugManager()
{
    Assert(crefSContextForDiag > 0);
    Assert(this->debugManager != nullptr);

    LONG lref = InterlockedDecrement(&crefSContextForDiag);

    if (lref == 0)
    {
        if (this->recyclableData != nullptr)
        {
            this->recyclableData->returnedValueList = nullptr;
        }

        if (this->debugManager != nullptr)
        {
            this->debugManager->Close();
            HeapDelete(this->debugManager);
            this->debugManager = nullptr;
        }
    }
}